

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrueTypeEmbeddedFontWriter.cpp
# Opt level: O0

EStatusCode __thiscall
TrueTypeEmbeddedFontWriter::CreateHeadTableCheckSumAdjustment(TrueTypeEmbeddedFontWriter *this)

{
  EStatusCode EVar1;
  unsigned_long inLength;
  unsigned_long uVar2;
  unsigned_long checkSum;
  LongFilePositionType endStream;
  TrueTypeEmbeddedFontWriter *this_local;
  
  inLength = OutputStringBufferStream::GetCurrentPosition(&this->mFontFileStream);
  uVar2 = GetCheckSum(this,0,inLength);
  OutputStringBufferStream::SetPosition(&this->mFontFileStream,this->mHeadCheckSumOffset);
  TrueTypePrimitiveWriter::WriteULONG(&this->mPrimitivesWriter,0xb1b0afba - uVar2);
  OutputStringBufferStream::SetPosition(&this->mFontFileStream,inLength);
  EVar1 = TrueTypePrimitiveWriter::GetInternalState(&this->mPrimitivesWriter);
  return EVar1;
}

Assistant:

EStatusCode TrueTypeEmbeddedFontWriter::CreateHeadTableCheckSumAdjustment()
{
	LongFilePositionType endStream = mFontFileStream.GetCurrentPosition();
    unsigned long checkSum = 0xb1b0afba - GetCheckSum(0, (unsigned long)endStream);

	mFontFileStream.SetPosition(mHeadCheckSumOffset); 
	mPrimitivesWriter.WriteULONG(checkSum);
	mFontFileStream.SetPosition(endStream); // restoring position just for kicks

	return mPrimitivesWriter.GetInternalState();
}